

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalCommonGenerator::GetTargetFortranFlags
          (string *__return_storage_ptr__,cmLocalCommonGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmMakefile *pcVar1;
  string_view source;
  bool bVar2;
  int iVar3;
  string *psVar4;
  undefined4 extraout_var;
  ulong uVar5;
  string local_280;
  undefined1 local_260 [8];
  string flg;
  string *id;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_218;
  undefined1 local_1f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_1d8;
  cmValue local_1b8;
  cmValue modpath_flag;
  allocator<char> local_189;
  string local_188;
  undefined1 local_168 [8];
  string incflag;
  string local_140;
  undefined1 local_120 [8];
  string modflag;
  string local_f8;
  string local_d8 [32];
  string_view local_b8;
  string local_a8;
  undefined1 local_88 [8];
  string mod_dir;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  string *local_28;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmLocalCommonGenerator *this_local;
  string *flags;
  
  local_29 = 0;
  local_28 = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmLocalCommonGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_Fortran_MODOUT_FLAG",&local_51);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_50);
  (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[7])
            (this,__return_storage_ptr__,psVar4);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  psVar4 = config_local;
  iVar3 = (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[0x16])();
  cmGeneratorTarget::GetFortranModuleDirectory
            ((string *)local_88,(cmGeneratorTarget *)psVar4,(string *)CONCAT44(extraout_var,iVar3));
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[2])
              (local_d8,this,local_88);
    local_b8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_d8);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_a8,(cmOutputConverter *)this,local_b8,SHELL,false);
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string(local_d8);
  }
  else {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_Fortran_MODDIR_DEFAULT",
               (allocator<char> *)(modflag.field_2._M_local_buf + 0xf));
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
    std::__cxx11::string::operator=((string *)local_88,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)(modflag.field_2._M_local_buf + 0xf));
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"CMAKE_Fortran_MODDIR_FLAG",
               (allocator<char> *)(incflag.field_2._M_local_buf + 0xf));
    psVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_140);
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string&>
              ((string *)local_120,psVar4,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)(incflag.field_2._M_local_buf + 0xf));
    (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[7])
              (this,__return_storage_ptr__,local_120);
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"CMAKE_Fortran_MODDIR_INCLUDE_FLAG",&local_189);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_188);
    std::__cxx11::string::string((string *)local_168,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                ((string *)&modpath_flag,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::__cxx11::string::operator=((string *)local_168,(string *)&modpath_flag);
      std::__cxx11::string::~string((string *)&modpath_flag);
      (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[7])
                (this,__return_storage_ptr__,(string *)local_168);
    }
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string((string *)local_120);
  }
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"CMAKE_Fortran_MODPATH_FLAG",
             (allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1b8 = cmMakefile::GetDefinition(pcVar1,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_1b8);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1f8);
    psVar4 = config_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"C",(allocator<char> *)((long)&__range2 + 7));
    cmLocalGenerator::GetIncludeDirectories
              (&this->super_cmLocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1f8,(cmGeneratorTarget *)psVar4,&local_218,local_28);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1f8);
    id = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1f8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&id);
      if (!bVar2) break;
      flg.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      psVar4 = cmValue::operator*[abi_cxx11_(&local_1b8);
      source = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)flg.field_2._8_8_)
      ;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_280,(cmOutputConverter *)this,source,SHELL,false);
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string>
                ((string *)local_260,psVar4,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[7])
                (this,__return_storage_ptr__,local_260);
      std::__cxx11::string::~string((string *)local_260);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  }
  local_29 = 1;
  std::__cxx11::string::~string((string *)local_88);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalCommonGenerator::GetTargetFortranFlags(
  cmGeneratorTarget const* target, std::string const& config)
{
  std::string flags;

  // Enable module output if necessary.
  this->AppendFlags(
    flags, this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODOUT_FLAG"));

  // Add a module output directory flag if necessary.
  std::string mod_dir =
    target->GetFortranModuleDirectory(this->GetWorkingDirectory());
  if (!mod_dir.empty()) {
    mod_dir = this->ConvertToOutputFormat(
      this->MaybeRelativeToWorkDir(mod_dir), cmOutputConverter::SHELL);
  } else {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
  }
  if (!mod_dir.empty()) {
    std::string modflag = cmStrCat(
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG"),
      mod_dir);
    this->AppendFlags(flags, modflag);
    // Some compilers do not search their own module output directory
    // for using other modules.  Add an include directory explicitly
    // for consistency with compilers that do search it.
    std::string incflag =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_INCLUDE_FLAG");
    if (!incflag.empty()) {
      incflag = cmStrCat(incflag, mod_dir);
      this->AppendFlags(flags, incflag);
    }
  }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if (cmValue modpath_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG")) {
    std::vector<std::string> includes;
    this->GetIncludeDirectories(includes, target, "C", config);
    for (std::string const& id : includes) {
      std::string flg =
        cmStrCat(*modpath_flag,
                 this->ConvertToOutputFormat(id, cmOutputConverter::SHELL));
      this->AppendFlags(flags, flg);
    }
  }

  return flags;
}